

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O1

class_interface hello_world_class_impl_interface_singleton(void)

{
  return &hello_world_class_impl_interface_singleton::hello_world_interface;
}

Assistant:

class_interface hello_world_class_impl_interface_singleton()
{
	static struct class_interface_type hello_world_interface
	{
		&hello_world_class_impl_interface_create,
			&hello_world_class_impl_interface_constructor,
			&hello_world_class_impl_interface_static_get,
			&hello_world_class_impl_interface_static_set,
			&hello_world_class_impl_interface_static_invoke,
			&hello_world_class_impl_interface_static_await,
			&hello_world_class_impl_interface_destroy
	};

	return &hello_world_interface;
}